

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Relay.cpp
# Opt level: O3

bool __thiscall RenX_RelayPlugin::initialize(RenX_RelayPlugin *this)

{
  undefined1 *in_config;
  size_type __len2;
  char *__s;
  undefined1 uVar1;
  rep rVar2;
  Config *pCVar3;
  Config *in_config_00;
  pointer pbVar4;
  undefined1 auVar5 [16];
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  upstream_names;
  upstream_settings upstream_settings;
  container_type local_f8;
  upstream_settings local_e0;
  
  rVar2 = std::chrono::_V2::steady_clock::now();
  (this->m_init_time).__d.__r = rVar2;
  in_config = &this->field_0x38;
  get_settings(&local_e0,this,(Config *)in_config);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&(this->m_default_settings).m_label,&local_e0.m_label);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&(this->m_default_settings).m_upstream_hostname,&local_e0.m_upstream_hostname);
  (this->m_default_settings).m_upstream_port = local_e0.m_upstream_port;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&(this->m_default_settings).m_rcon_username,&local_e0.m_rcon_username);
  (this->m_default_settings).m_log_traffic = (bool)local_e0.m_log_traffic;
  (this->m_default_settings).m_fake_pings = (bool)local_e0.m_fake_pings;
  (this->m_default_settings).m_fake_ignored_commands = (bool)local_e0.m_fake_ignored_commands;
  (this->m_default_settings).m_sanitize_names = (bool)local_e0.m_sanitize_names;
  (this->m_default_settings).m_sanitize_ips = (bool)local_e0.m_sanitize_ips;
  (this->m_default_settings).m_sanitize_hwids = (bool)local_e0.m_sanitize_hwids;
  (this->m_default_settings).m_sanitize_steam_ids = (bool)local_e0.m_sanitize_steam_ids;
  (this->m_default_settings).m_suppress_unknown_commands = local_e0.m_suppress_unknown_commands;
  (this->m_default_settings).m_suppress_unknown_commands = local_e0.m_suppress_unknown_commands;
  (this->m_default_settings).m_suppress_blacklisted_commands =
       local_e0.m_suppress_blacklisted_commands;
  (this->m_default_settings).m_suppress_chat_logs = local_e0.m_suppress_chat_logs;
  (this->m_default_settings).m_suppress_rcon_command_logs = local_e0.m_suppress_rcon_command_logs;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_RenX::Server_&,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_RenX::Server_&,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_move_assign(&(this->m_default_settings).m_fake_command_table._M_h,
                   &local_e0.m_fake_command_table);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_RenX::Server_&,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_RenX::Server_&,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_e0.m_fake_command_table._M_h);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.m_rcon_username._M_dataplus._M_p != &local_e0.m_rcon_username.field_2) {
    operator_delete(local_e0.m_rcon_username._M_dataplus._M_p,
                    local_e0.m_rcon_username.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.m_upstream_hostname._M_dataplus._M_p != &local_e0.m_upstream_hostname.field_2) {
    operator_delete(local_e0.m_upstream_hostname._M_dataplus._M_p,
                    local_e0.m_upstream_hostname.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.m_label._M_dataplus._M_p != &local_e0.m_label.field_2) {
    operator_delete(local_e0.m_label._M_dataplus._M_p,
                    local_e0.m_label.field_2._M_allocated_capacity + 1);
  }
  auVar5 = Jupiter::Config::get(in_config,9,"Upstreams",0,"");
  jessilib::
  word_split<std::vector,_std::basic_string_view<char,_std::char_traits<char>_>,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
            (&local_f8,auVar5._8_8_,auVar5._8_8_ + auVar5._0_8_," \t","");
  if (local_f8.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_f8.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar4 = local_f8.
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      __len2 = pbVar4->_M_len;
      __s = pbVar4->_M_str;
      pCVar3 = (Config *)Jupiter::Config::getSection(in_config,__len2,__s);
      in_config_00 = (Config *)in_config;
      if (pCVar3 != (Config *)0x0) {
        in_config_00 = pCVar3;
      }
      get_settings(&local_e0,this,in_config_00);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (&local_e0.m_label,0,local_e0.m_label._M_string_length,__s,__len2);
      std::
      vector<RenX_RelayPlugin::upstream_settings,_std::allocator<RenX_RelayPlugin::upstream_settings>_>
      ::emplace_back<RenX_RelayPlugin::upstream_settings>(&this->m_configured_upstreams,&local_e0);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_RenX::Server_&,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_RenX::Server_&,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_e0.m_fake_command_table._M_h);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.m_rcon_username._M_dataplus._M_p != &local_e0.m_rcon_username.field_2) {
        operator_delete(local_e0.m_rcon_username._M_dataplus._M_p,
                        local_e0.m_rcon_username.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.m_upstream_hostname._M_dataplus._M_p != &local_e0.m_upstream_hostname.field_2)
      {
        operator_delete(local_e0.m_upstream_hostname._M_dataplus._M_p,
                        local_e0.m_upstream_hostname.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.m_label._M_dataplus._M_p != &local_e0.m_label.field_2) {
        operator_delete(local_e0.m_label._M_dataplus._M_p,
                        local_e0.m_label.field_2._M_allocated_capacity + 1);
      }
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != local_f8.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((this->m_configured_upstreams).
      super__Vector_base<RenX_RelayPlugin::upstream_settings,_std::allocator<RenX_RelayPlugin::upstream_settings>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->m_configured_upstreams).
      super__Vector_base<RenX_RelayPlugin::upstream_settings,_std::allocator<RenX_RelayPlugin::upstream_settings>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar1 = 0;
  }
  else {
    uVar1 = Jupiter::Plugin::initialize();
  }
  if (local_f8.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (bool)uVar1;
}

Assistant:

bool RenX_RelayPlugin::initialize() {
	m_init_time = std::chrono::steady_clock::now();
	// TODO: add BindHost, BindPort
	// TODO: invent a way to send a custom hostname directly to the devbot, rather than having to rely on manual configuration
	// TODO: Add bidirectional relay support (i.e: bot link)
	// TODO: Add game data relay support (so players connect through this)
	// 			* Drop packets for non-players when traffic spikes
	//			* notify game server to set failover

	m_default_settings = get_settings(config);

	std::string_view upstreams_list = config.get("Upstreams"sv, ""sv);
	std::vector<std::string_view> upstream_names = jessilib::word_split_view(upstreams_list, WHITESPACE_SV);
	for (auto upstream_name : upstream_names) {
		auto upstream_config = config.getSection(upstream_name);
		if (upstream_config == nullptr) {
			upstream_config = &config;
		}

		auto upstream_settings = get_settings(*upstream_config);
		upstream_settings.m_label = upstream_name;
		m_configured_upstreams.push_back(std::move(upstream_settings));
	}

	return !m_configured_upstreams.empty() && RenX::Plugin::initialize();
}